

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O0

Llb_Mnn_t * Llb_MnnStart(Aig_Man_t *pInit,Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  uint uVar1;
  int iVar2;
  Llb_Mnn_t *p_00;
  DdManager *pDVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  int *piVar6;
  Aig_Obj_t *pObj_00;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Llb_Mnn_t *p;
  Gia_ParLlb_t *pPars_local;
  Aig_Man_t *pAig_local;
  Aig_Man_t *pInit_local;
  
  p_00 = (Llb_Mnn_t *)calloc(1,0xd0);
  p_00->pInit = pInit;
  p_00->pAig = pAig;
  p_00->pPars = pPars;
  uVar1 = Aig_ManObjNumMax(pAig);
  pDVar3 = Cudd_Init(uVar1,0,0x100,0x40000,0);
  p_00->dd = pDVar3;
  uVar1 = Aig_ManRegNum(pAig);
  pDVar3 = Cudd_Init(uVar1,0,0x100,0x40000,0);
  p_00->ddG = pDVar3;
  uVar1 = Aig_ManCiNum(pAig);
  pDVar3 = Cudd_Init(uVar1,0,0x100,0x40000,0);
  p_00->ddR = pDVar3;
  Cudd_AutodynEnable(p_00->dd,CUDD_REORDER_SYMM_SIFT);
  Cudd_AutodynEnable(p_00->ddG,CUDD_REORDER_SYMM_SIFT);
  Cudd_AutodynEnable(p_00->ddR,CUDD_REORDER_SYMM_SIFT);
  pVVar4 = Vec_PtrAlloc(100);
  p_00->vRings = pVVar4;
  iVar2 = Aig_ManCiNum(pAig);
  pVVar4 = Vec_PtrAlloc(iVar2);
  p_00->vLeaves = pVVar4;
  for (local_34 = 0; iVar2 = Vec_PtrSize(pAig->vCis), local_34 < iVar2; local_34 = local_34 + 1) {
    pvVar5 = Vec_PtrEntry(pAig->vCis,local_34);
    Vec_PtrPush(p_00->vLeaves,pvVar5);
  }
  iVar2 = Aig_ManCoNum(pAig);
  pVVar4 = Vec_PtrAlloc(iVar2);
  p_00->vRoots = pVVar4;
  for (local_34 = 0; iVar2 = Saig_ManRegNum(pAig), local_34 < iVar2; local_34 = local_34 + 1) {
    pVVar4 = pAig->vCos;
    iVar2 = Saig_ManPoNum(pAig);
    pvVar5 = Vec_PtrEntry(pVVar4,local_34 + iVar2);
    Vec_PtrPush(p_00->vRoots,pvVar5);
  }
  iVar2 = Aig_ManObjNumMax(pAig);
  piVar6 = (int *)calloc((long)iVar2,4);
  p_00->pOrderL = piVar6;
  iVar2 = Aig_ManObjNumMax(pAig);
  piVar6 = (int *)calloc((long)iVar2,4);
  p_00->pOrderL2 = piVar6;
  iVar2 = Aig_ManObjNumMax(pAig);
  piVar6 = (int *)calloc((long)iVar2,4);
  p_00->pOrderG = piVar6;
  iVar2 = Aig_ManObjNumMax(pAig);
  piVar6 = (int *)calloc((long)iVar2,4);
  p_00->pVars2Q = piVar6;
  for (local_34 = 0; iVar2 = Vec_PtrSize(pAig->vCis), local_34 < iVar2; local_34 = local_34 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_34);
    piVar6 = p_00->pVars2Q;
    iVar2 = Aig_ObjId(pObj_00);
    piVar6[iVar2] = 1;
  }
  for (local_34 = 0; iVar2 = Aig_ManObjNumMax(pAig), local_34 < iVar2; local_34 = local_34 + 1) {
    p_00->pOrderG[local_34] = local_34;
    p_00->pOrderL2[local_34] = local_34;
    p_00->pOrderL[local_34] = local_34;
  }
  Llb_NonlinPrepareVarMap(p_00);
  return p_00;
}

Assistant:

Llb_Mnn_t * Llb_MnnStart( Aig_Man_t * pInit, Aig_Man_t * pAig, Gia_ParLlb_t *  pPars )
{
    Llb_Mnn_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = ABC_CALLOC( Llb_Mnn_t, 1 );
    p->pInit = pInit;
    p->pAig  = pAig;
    p->pPars = pPars;
    p->dd    = Cudd_Init( Aig_ManObjNumMax(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddG   = Cudd_Init( Aig_ManRegNum(pAig),    0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddR   = Cudd_Init( Aig_ManCiNum(pAig),     0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
    Cudd_AutodynEnable( p->ddG, CUDD_REORDER_SYMM_SIFT );
    Cudd_AutodynEnable( p->ddR, CUDD_REORDER_SYMM_SIFT );
    p->vRings = Vec_PtrAlloc( 100 );
    // create leaves
    p->vLeaves = Vec_PtrAlloc( Aig_ManCiNum(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Vec_PtrPush( p->vLeaves, pObj );
    // create roots
    p->vRoots = Vec_PtrAlloc( Aig_ManCoNum(pAig) );
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_PtrPush( p->vRoots, pObj );
    // variables to quantify
    p->pOrderL = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->pOrderL2= ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->pOrderG = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->pVars2Q = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        p->pVars2Q[Aig_ObjId(pObj)] = 1;
    for ( i = 0; i < Aig_ManObjNumMax(pAig); i++ )
        p->pOrderL[i] = p->pOrderL2[i] = p->pOrderG[i] = i;
    Llb_NonlinPrepareVarMap( p ); 
    return p;
}